

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O0

VulkanRecycledFence * __thiscall
VulkanUtilities::VulkanSyncObjectManager::CreateFence
          (VulkanRecycledFence *__return_storage_ptr__,VulkanSyncObjectManager *this)

{
  PFN_vkCreateFence p_Var1;
  bool bVar2;
  reference ppVVar3;
  VkDevice pVVar4;
  enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager> local_80;
  VkFence local_70;
  VkFence vkFence;
  VkFenceCreateInfo FenceCI;
  enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager> local_38;
  value_type local_28;
  value_type vkFence_1;
  lock_guard<std::mutex> Lock;
  VulkanSyncObjectManager *this_local;
  
  Lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&vkFence_1,&this->m_FencePoolGuard);
  bVar2 = std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::empty(&this->m_FencePool);
  if (!bVar2) {
    ppVVar3 = std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::back(&this->m_FencePool);
    local_28 = *ppVVar3;
    std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::pop_back(&this->m_FencePool);
    std::enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>::shared_from_this
              (&local_38);
    RecycledSyncObject<VulkanUtilities::VkFenceType>::RecycledSyncObject
              (__return_storage_ptr__,
               (shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_38,local_28);
    std::shared_ptr<VulkanUtilities::VulkanSyncObjectManager>::~shared_ptr
              ((shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_38);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&vkFence_1);
  p_Var1 = vkCreateFence;
  if (bVar2) {
    FenceCI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    FenceCI._4_4_ = 0;
    FenceCI.pNext = (void *)0x0;
    local_70 = (NativeType)0x0;
    vkFence = (VkFence)0x8;
    pVVar4 = VulkanLogicalDevice::GetVkDevice(this->m_LogicalDevice);
    (*p_Var1)(pVVar4,(VkFenceCreateInfo *)&vkFence,(VkAllocationCallbacks *)0x0,&local_70);
    std::enable_shared_from_this<VulkanUtilities::VulkanSyncObjectManager>::shared_from_this
              (&local_80);
    RecycledSyncObject<VulkanUtilities::VkFenceType>::RecycledSyncObject
              (__return_storage_ptr__,
               (shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_80,local_70);
    std::shared_ptr<VulkanUtilities::VulkanSyncObjectManager>::~shared_ptr
              ((shared_ptr<VulkanUtilities::VulkanSyncObjectManager> *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

VulkanRecycledFence VulkanSyncObjectManager::CreateFence()
{
    {
        std::lock_guard<std::mutex> Lock{m_FencePoolGuard};

        if (!m_FencePool.empty())
        {
            auto vkFence = m_FencePool.back();
            m_FencePool.pop_back();
            return {shared_from_this(), vkFence};
        }
    }

    VkFenceCreateInfo FenceCI = {};
    VkFence           vkFence = VK_NULL_HANDLE;

    FenceCI.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
    vkCreateFence(m_LogicalDevice.GetVkDevice(), &FenceCI, nullptr, &vkFence);

    return {shared_from_this(), vkFence};
}